

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86_avx512::forward
          (BinaryOp_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  Mat *pMVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int _h;
  uint _elempack;
  int _d;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Option *pOVar13;
  int iVar14;
  size_t sVar15;
  Mat *b;
  Mat *pMVar16;
  Option *opt_00;
  Option *_elemsize;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Mat local_128;
  Mat local_d8;
  Mat local_88;
  Mat *local_38;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = pMVar4->dims;
  local_d8.dims = pMVar4[1].dims;
  uVar8 = local_d8.dims;
  if (local_d8.dims < (int)uVar3) {
    uVar8 = uVar3;
  }
  piVar5 = pMVar4->refcount;
  local_88.data = pMVar4->data;
  local_88.refcount = pMVar4->refcount;
  local_88.elemsize = pMVar4->elemsize;
  local_88.elempack = pMVar4->elempack;
  local_88.allocator = pMVar4->allocator;
  auVar6 = vpinsrd_avx(ZEXT416(uVar3),pMVar4->w,1);
  uVar1 = pMVar4->h;
  uVar2 = pMVar4->d;
  auVar20._4_4_ = uVar2;
  auVar20._0_4_ = uVar1;
  auVar20._8_8_ = 0;
  auVar6 = vpunpcklqdq_avx(auVar6,auVar20);
  local_88.dims = auVar6._0_4_;
  local_88.w = auVar6._4_4_;
  local_88.h = auVar6._8_4_;
  local_88.d = auVar6._12_4_;
  local_88.c = pMVar4->c;
  local_88.cstep = pMVar4->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
    local_d8.dims = pMVar4[1].dims;
  }
  piVar5 = pMVar4[1].refcount;
  local_d8.data = pMVar4[1].data;
  local_d8.refcount = pMVar4[1].refcount;
  local_d8.elemsize = pMVar4[1].elemsize;
  local_d8.elempack = pMVar4[1].elempack;
  local_d8.allocator = pMVar4[1].allocator;
  uVar9 = pMVar4[1].w;
  uVar10 = pMVar4[1].h;
  uVar11 = pMVar4[1].d;
  uVar12 = pMVar4[1].c;
  local_d8.cstep = pMVar4[1].cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  pMVar16 = pMVar4 + 1;
  local_d8.w = uVar9;
  local_d8.h = uVar10;
  local_d8.d = uVar11;
  local_d8.c = uVar12;
  if (pMVar4->dims < (int)uVar8) {
    local_38 = pMVar16;
    if (uVar8 == 2) {
      sVar15 = (long)pMVar4->elempack * (long)pMVar4->w;
      iVar14 = (int)sVar15;
      if (iVar14 == pMVar4[1].elempack * pMVar4[1].h) {
        Mat::reshape(&local_128,pMVar4,1,pMVar4->w,opt->workspace_allocator);
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + 1;
          UNLOCK();
        }
        if (local_88.refcount != (int *)0x0) {
          LOCK();
          *local_88.refcount = *local_88.refcount + -1;
          UNLOCK();
          if (*local_88.refcount == 0) {
            if (local_88.allocator == (Allocator *)0x0) {
              if (local_88.data != (void *)0x0) {
                free(local_88.data);
              }
            }
            else {
              (*(local_88.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_88.data = local_128.data;
        local_88.refcount = local_128.refcount;
        local_88.elemsize = local_128.elemsize;
        local_88.elempack = local_128.elempack;
        local_88.allocator = local_128.allocator;
        local_88.dims = local_128.dims;
        local_88.w = local_128.w;
        local_88.h = local_128.h;
        local_88.d = local_128.d;
        local_88.c = local_128.c;
        local_88.cstep = local_128.cstep;
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              if (local_128.data != (void *)0x0) {
                free(local_128.data);
              }
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        bVar17 = false;
      }
      else {
        local_88.dims = 2;
        local_88.elempack = 1;
        bVar17 = false;
        local_88.elemsize = pMVar4->elemsize / (ulong)(long)pMVar4->elempack;
        local_88.w = iVar14;
        local_88.cstep = sVar15;
      }
    }
    else {
      bVar17 = uVar8 == 3;
      if (pMVar4->dims == 1 && uVar8 == 3) {
        sVar15 = (long)pMVar4->elempack * (long)pMVar4->w;
        iVar14 = (int)sVar15;
        if (iVar14 == pMVar4[1].elempack * pMVar4[1].c) {
          Mat::reshape(&local_128,pMVar4,1,1,pMVar4->w,opt->workspace_allocator);
          if (local_128.refcount != (int *)0x0) {
            LOCK();
            *local_128.refcount = *local_128.refcount + 1;
            UNLOCK();
          }
          if (local_88.refcount != (int *)0x0) {
            LOCK();
            *local_88.refcount = *local_88.refcount + -1;
            UNLOCK();
            if (*local_88.refcount == 0) {
              if (local_88.allocator == (Allocator *)0x0) {
                if (local_88.data != (void *)0x0) {
                  free(local_88.data);
                }
              }
              else {
                (*(local_88.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_88.data = local_128.data;
          local_88.refcount = local_128.refcount;
          local_88.elemsize = local_128.elemsize;
          local_88.elempack = local_128.elempack;
          local_88.allocator = local_128.allocator;
          local_88.dims = local_128.dims;
          local_88.w = local_128.w;
          local_88.h = local_128.h;
          local_88.d = local_128.d;
          local_88.c = local_128.c;
          local_88.cstep = local_128.cstep;
          if (local_128.refcount != (int *)0x0) {
            LOCK();
            *local_128.refcount = *local_128.refcount + -1;
            UNLOCK();
            if (*local_128.refcount == 0) {
              if (local_128.allocator == (Allocator *)0x0) {
                if (local_128.data != (void *)0x0) {
                  free(local_128.data);
                }
              }
              else {
                (*(local_128.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          local_88.dims = 3;
          local_88.elempack = 1;
          local_88.elemsize = pMVar4->elemsize / (ulong)(long)pMVar4->elempack;
          local_88.w = iVar14;
          local_88.cstep = sVar15;
        }
        bVar17 = true;
      }
      iVar14 = pMVar4->dims;
      if ((bool)(iVar14 == 2 & bVar17)) {
        Mat::reshape(&local_128,pMVar4,1,pMVar4->w,pMVar4->h,opt->workspace_allocator);
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + 1;
          UNLOCK();
        }
        if (local_88.refcount != (int *)0x0) {
          LOCK();
          *local_88.refcount = *local_88.refcount + -1;
          UNLOCK();
          if (*local_88.refcount == 0) {
            if (local_88.allocator == (Allocator *)0x0) {
              if (local_88.data != (void *)0x0) {
                free(local_88.data);
              }
            }
            else {
              (*(local_88.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_88.data = local_128.data;
        local_88.refcount = local_128.refcount;
        local_88.elemsize = local_128.elemsize;
        local_88.elempack = local_128.elempack;
        local_88.allocator = local_128.allocator;
        local_88.dims = local_128.dims;
        local_88.w = local_128.w;
        local_88.h = local_128.h;
        local_88.d = local_128.d;
        local_88.c = local_128.c;
        local_88.cstep = local_128.cstep;
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              if (local_128.data != (void *)0x0) {
                free(local_128.data);
              }
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar14 = pMVar4->dims;
      }
      bVar17 = uVar8 == 4;
      if ((bVar17) && (iVar14 == 1)) {
        sVar15 = (long)pMVar4->elempack * (long)pMVar4->w;
        iVar14 = (int)sVar15;
        if (iVar14 == pMVar4[1].elempack * pMVar4[1].c) {
          Mat::reshape(&local_128,pMVar4,1,1,1,pMVar4->w,opt->workspace_allocator);
          if (local_128.refcount != (int *)0x0) {
            LOCK();
            *local_128.refcount = *local_128.refcount + 1;
            UNLOCK();
          }
          if (local_88.refcount != (int *)0x0) {
            LOCK();
            *local_88.refcount = *local_88.refcount + -1;
            UNLOCK();
            if (*local_88.refcount == 0) {
              if (local_88.allocator == (Allocator *)0x0) {
                if (local_88.data != (void *)0x0) {
                  free(local_88.data);
                }
              }
              else {
                (*(local_88.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_88.data = local_128.data;
          local_88.refcount = local_128.refcount;
          local_88.elemsize = local_128.elemsize;
          local_88.elempack = local_128.elempack;
          local_88.allocator = local_128.allocator;
          local_88.dims = local_128.dims;
          local_88.w = local_128.w;
          local_88.h = local_128.h;
          local_88.d = local_128.d;
          local_88.c = local_128.c;
          local_88.cstep = local_128.cstep;
          if (local_128.refcount != (int *)0x0) {
            LOCK();
            *local_128.refcount = *local_128.refcount + -1;
            UNLOCK();
            if (*local_128.refcount == 0) {
              if (local_128.allocator == (Allocator *)0x0) {
                if (local_128.data != (void *)0x0) {
                  free(local_128.data);
                }
              }
              else {
                (*(local_128.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          local_88.dims = 4;
          local_88.elempack = 1;
          local_88.elemsize = pMVar4->elemsize / (ulong)(long)pMVar4->elempack;
          local_88.w = iVar14;
          local_88.cstep = sVar15;
        }
      }
    }
    iVar14 = pMVar4->dims;
    if ((bool)(iVar14 == 2 & bVar17)) {
      Mat::reshape(&local_128,pMVar4,1,1,pMVar4->w,pMVar4->h,opt->workspace_allocator);
      if (local_128.refcount != (int *)0x0) {
        LOCK();
        *local_128.refcount = *local_128.refcount + 1;
        UNLOCK();
      }
      if (local_88.refcount != (int *)0x0) {
        LOCK();
        *local_88.refcount = *local_88.refcount + -1;
        UNLOCK();
        if (*local_88.refcount == 0) {
          if (local_88.allocator == (Allocator *)0x0) {
            if (local_88.data != (void *)0x0) {
              free(local_88.data);
            }
          }
          else {
            (*(local_88.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_88.data = local_128.data;
      local_88.refcount = local_128.refcount;
      local_88.elemsize = local_128.elemsize;
      local_88.elempack = local_128.elempack;
      local_88.allocator = local_128.allocator;
      local_88.dims = local_128.dims;
      local_88.w = local_128.w;
      local_88.h = local_128.h;
      local_88.d = local_128.d;
      local_88.c = local_128.c;
      local_88.cstep = local_128.cstep;
      if (local_128.refcount != (int *)0x0) {
        LOCK();
        *local_128.refcount = *local_128.refcount + -1;
        UNLOCK();
        if (*local_128.refcount == 0) {
          if (local_128.allocator == (Allocator *)0x0) {
            if (local_128.data != (void *)0x0) {
              free(local_128.data);
            }
          }
          else {
            (*(local_128.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar14 = pMVar4->dims;
    }
    pMVar16 = local_38;
    if (!(bool)(bVar17 & iVar14 == 3)) goto LAB_0039cd85;
    Mat::reshape(&local_128,pMVar4,1,pMVar4->w,pMVar4->h,pMVar4->c,opt->workspace_allocator);
    if (local_128.refcount != (int *)0x0) {
      LOCK();
      *local_128.refcount = *local_128.refcount + 1;
      UNLOCK();
    }
    if (local_88.refcount != (int *)0x0) {
      LOCK();
      *local_88.refcount = *local_88.refcount + -1;
      UNLOCK();
      if (*local_88.refcount == 0) {
        if (local_88.allocator == (Allocator *)0x0) {
          if (local_88.data != (void *)0x0) {
            free(local_88.data);
          }
        }
        else {
          (*(local_88.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_88.data = local_128.data;
    local_88.refcount = local_128.refcount;
    local_88.elemsize = local_128.elemsize;
    local_88.elempack = local_128.elempack;
    local_88.allocator = local_128.allocator;
    local_88.dims = local_128.dims;
    local_88.w = local_128.w;
    local_88.h = local_128.h;
    local_88.d = local_128.d;
    local_88.c = local_128.c;
    local_88.cstep = local_128.cstep;
    if (local_128.refcount != (int *)0x0) {
      LOCK();
      *local_128.refcount = *local_128.refcount + -1;
      UNLOCK();
      if (*local_128.refcount == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (pMVar4[1].dims < 4) goto LAB_0039d1ee;
  }
  else {
LAB_0039cd85:
    if (pMVar4[1].dims < (int)uVar8) {
      if (uVar8 == 2) {
        sVar15 = (long)pMVar4[1].elempack * (long)pMVar4[1].w;
        iVar14 = (int)sVar15;
        if (iVar14 == pMVar4->elempack * pMVar4->h) {
          Mat::reshape(&local_128,pMVar16,1,pMVar4[1].w,opt->workspace_allocator);
          if (local_128.refcount != (int *)0x0) {
            LOCK();
            *local_128.refcount = *local_128.refcount + 1;
            UNLOCK();
          }
          if (local_d8.refcount != (int *)0x0) {
            LOCK();
            *local_d8.refcount = *local_d8.refcount + -1;
            UNLOCK();
            if (*local_d8.refcount == 0) {
              if (local_d8.allocator == (Allocator *)0x0) {
                if (local_d8.data != (void *)0x0) {
                  free(local_d8.data);
                }
              }
              else {
                (*(local_d8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_d8.data = local_128.data;
          local_d8.refcount = local_128.refcount;
          local_d8.elemsize = local_128.elemsize;
          local_d8.elempack = local_128.elempack;
          local_d8.allocator = local_128.allocator;
          local_d8.dims = local_128.dims;
          local_d8.w = local_128.w;
          local_d8.h = local_128.h;
          local_d8.d = local_128.d;
          local_d8.c = local_128.c;
          local_d8.cstep = local_128.cstep;
          if (local_128.refcount != (int *)0x0) {
            LOCK();
            *local_128.refcount = *local_128.refcount + -1;
            UNLOCK();
            if (*local_128.refcount == 0) {
              if (local_128.allocator == (Allocator *)0x0) {
LAB_0039d1e1:
                local_d8.data = local_128.data;
                local_d8.refcount = local_128.refcount;
                local_d8.elemsize = local_128.elemsize;
                local_d8.elempack = local_128.elempack;
                local_d8.allocator = local_128.allocator;
                local_d8.c = local_128.c;
                local_d8.cstep = local_128.cstep;
                if (local_128.data != (void *)0x0) {
                  local_d8.cstep = local_128.cstep;
                  free(local_128.data);
                }
              }
              else {
                (*(local_128.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          local_d8.dims = 2;
          local_d8.elempack = 1;
          local_d8.elemsize = pMVar4[1].elemsize / (ulong)(long)pMVar4[1].elempack;
          local_d8.w = iVar14;
          local_d8.cstep = sVar15;
        }
LAB_0039d1ee:
        iVar14 = pMVar4[1].dims;
      }
      else {
        bVar17 = uVar8 == 3;
        if (pMVar4[1].dims == 1 && uVar8 == 3) {
          sVar15 = (long)pMVar4[1].elempack * (long)pMVar4[1].w;
          iVar14 = (int)sVar15;
          if (iVar14 == pMVar4->elempack * pMVar4->c) {
            Mat::reshape(&local_128,pMVar16,1,1,pMVar4[1].w,opt->workspace_allocator);
            if (local_128.refcount != (int *)0x0) {
              LOCK();
              *local_128.refcount = *local_128.refcount + 1;
              UNLOCK();
            }
            if (local_d8.refcount != (int *)0x0) {
              LOCK();
              *local_d8.refcount = *local_d8.refcount + -1;
              UNLOCK();
              if (*local_d8.refcount == 0) {
                if (local_d8.allocator == (Allocator *)0x0) {
                  if (local_d8.data != (void *)0x0) {
                    free(local_d8.data);
                  }
                }
                else {
                  (*(local_d8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_d8.data = local_128.data;
            local_d8.refcount = local_128.refcount;
            local_d8.elemsize = local_128.elemsize;
            local_d8.elempack = local_128.elempack;
            local_d8.allocator = local_128.allocator;
            local_d8.dims = local_128.dims;
            local_d8.w = local_128.w;
            local_d8.h = local_128.h;
            local_d8.d = local_128.d;
            local_d8.c = local_128.c;
            local_d8.cstep = local_128.cstep;
            if (local_128.refcount != (int *)0x0) {
              LOCK();
              *local_128.refcount = *local_128.refcount + -1;
              UNLOCK();
              if (*local_128.refcount == 0) {
                if (local_128.allocator == (Allocator *)0x0) {
                  if (local_128.data != (void *)0x0) {
                    free(local_128.data);
                  }
                }
                else {
                  (*(local_128.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            local_d8.dims = 3;
            local_d8.elempack = 1;
            local_d8.elemsize = pMVar4[1].elemsize / (ulong)(long)pMVar4[1].elempack;
            local_d8.w = iVar14;
            local_d8.cstep = sVar15;
          }
          bVar17 = true;
        }
        iVar14 = pMVar4[1].dims;
        if ((bool)(iVar14 == 2 & bVar17)) {
          Mat::reshape(&local_128,pMVar16,1,pMVar4[1].w,pMVar4[1].h,opt->workspace_allocator);
          if (local_128.refcount != (int *)0x0) {
            LOCK();
            *local_128.refcount = *local_128.refcount + 1;
            UNLOCK();
          }
          if (local_d8.refcount != (int *)0x0) {
            LOCK();
            *local_d8.refcount = *local_d8.refcount + -1;
            UNLOCK();
            if (*local_d8.refcount == 0) {
              if (local_d8.allocator == (Allocator *)0x0) {
                if (local_d8.data != (void *)0x0) {
                  free(local_d8.data);
                }
              }
              else {
                (*(local_d8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_d8.data = local_128.data;
          local_d8.refcount = local_128.refcount;
          local_d8.elemsize = local_128.elemsize;
          local_d8.elempack = local_128.elempack;
          local_d8.allocator = local_128.allocator;
          local_d8.dims = local_128.dims;
          local_d8.w = local_128.w;
          local_d8.h = local_128.h;
          local_d8.d = local_128.d;
          local_d8.c = local_128.c;
          local_d8.cstep = local_128.cstep;
          if (local_128.refcount != (int *)0x0) {
            LOCK();
            *local_128.refcount = *local_128.refcount + -1;
            UNLOCK();
            if (*local_128.refcount == 0) {
              if (local_128.allocator == (Allocator *)0x0) goto LAB_0039d1e1;
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
          goto LAB_0039d1ee;
        }
      }
      if (iVar14 == 1 && uVar8 == 4) {
        sVar15 = (long)pMVar4[1].elempack * (long)pMVar4[1].w;
        iVar14 = (int)sVar15;
        if (iVar14 != pMVar4->elempack * pMVar4->c) {
          local_d8.dims = 4;
          local_d8.elempack = 1;
          local_d8.elemsize = pMVar4[1].elemsize / (ulong)(long)pMVar4[1].elempack;
          local_d8.w = iVar14;
          local_d8.cstep = sVar15;
          goto LAB_0039d55b;
        }
        Mat::reshape(&local_128,pMVar16,1,1,1,pMVar4[1].w,opt->workspace_allocator);
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + 1;
          UNLOCK();
        }
        if (local_d8.refcount != (int *)0x0) {
          LOCK();
          *local_d8.refcount = *local_d8.refcount + -1;
          UNLOCK();
          if (*local_d8.refcount == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              if (local_d8.data != (void *)0x0) {
                free(local_d8.data);
              }
            }
            else {
              (*(local_d8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_d8.data = local_128.data;
        local_d8.refcount = local_128.refcount;
        local_d8.elemsize = local_128.elemsize;
        local_d8.elempack = local_128.elempack;
        local_d8.allocator = local_128.allocator;
        local_d8.dims = local_128.dims;
        local_d8.w = local_128.w;
        local_d8.h = local_128.h;
        local_d8.d = local_128.d;
        local_d8.c = local_128.c;
        local_d8.cstep = local_128.cstep;
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              if (local_128.data != (void *)0x0) {
                free(local_128.data);
              }
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar14 = pMVar4[1].dims;
      }
      if ((uVar8 == 4) && (iVar14 == 2)) {
        Mat::reshape(&local_128,pMVar16,1,1,pMVar4[1].w,pMVar4[1].h,opt->workspace_allocator);
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + 1;
          UNLOCK();
        }
        if (local_d8.refcount != (int *)0x0) {
          LOCK();
          *local_d8.refcount = *local_d8.refcount + -1;
          UNLOCK();
          if (*local_d8.refcount == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              if (local_d8.data != (void *)0x0) {
                free(local_d8.data);
              }
            }
            else {
              (*(local_d8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_d8.data = local_128.data;
        local_d8.refcount = local_128.refcount;
        local_d8.elemsize = local_128.elemsize;
        local_d8.elempack = local_128.elempack;
        local_d8.allocator = local_128.allocator;
        local_d8.dims = local_128.dims;
        local_d8.w = local_128.w;
        local_d8.h = local_128.h;
        local_d8.d = local_128.d;
        local_d8.c = local_128.c;
        local_d8.cstep = local_128.cstep;
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              if (local_128.data != (void *)0x0) {
                free(local_128.data);
              }
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar14 = pMVar4[1].dims;
      }
      if ((uVar8 == 4) && (iVar14 == 3)) {
        Mat::reshape(&local_128,pMVar16,1,pMVar4[1].w,pMVar4[1].h,pMVar4[1].c,
                     opt->workspace_allocator);
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + 1;
          UNLOCK();
        }
        if (local_d8.refcount != (int *)0x0) {
          LOCK();
          *local_d8.refcount = *local_d8.refcount + -1;
          UNLOCK();
          if (*local_d8.refcount == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              if (local_d8.data != (void *)0x0) {
                free(local_d8.data);
              }
            }
            else {
              (*(local_d8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_d8.data = local_128.data;
        local_d8.refcount = local_128.refcount;
        local_d8.elemsize = local_128.elemsize;
        local_d8.elempack = local_128.elempack;
        local_d8.allocator = local_128.allocator;
        local_d8.dims = local_128.dims;
        local_d8.w = local_128.w;
        local_d8.h = local_128.h;
        local_d8.d = local_128.d;
        local_d8.c = local_128.c;
        local_d8.cstep = local_128.cstep;
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              if (local_128.data != (void *)0x0) {
                free(local_128.data);
              }
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
LAB_0039d55b:
  iVar14 = local_d8.w;
  if (local_d8.w < local_88.w) {
    iVar14 = local_88.w;
  }
  _h = local_d8.h;
  if (local_d8.h < local_88.h) {
    _h = local_88.h;
  }
  uVar3 = local_d8.c;
  if (local_d8.c < local_88.c) {
    uVar3 = local_88.c;
  }
  opt_00 = (Option *)(ulong)uVar3;
  _elemsize = (Option *)local_d8.elemsize;
  if (local_d8.elemsize < local_88.elemsize) {
    _elemsize = (Option *)local_88.elemsize;
  }
  _elempack = local_d8.elempack;
  if (local_d8.elempack < local_88.elempack) {
    _elempack = local_88.elempack;
  }
  pOVar13 = (Option *)(ulong)_elempack;
  pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  switch(uVar8) {
  case 1:
    opt_00 = (Option *)opt->blob_allocator;
    Mat::create(pMVar4,iVar14,(size_t)_elemsize,_elempack,(Allocator *)opt_00);
    break;
  case 2:
    Mat::create(pMVar4,iVar14,_h,(size_t)_elemsize,_elempack,opt->blob_allocator);
    opt_00 = pOVar13;
    break;
  case 3:
    Mat::create(pMVar4,iVar14,_h,uVar3,(size_t)_elemsize,_elempack,opt->blob_allocator);
    opt_00 = _elemsize;
    break;
  case 4:
    _d = local_d8.d;
    if (local_d8.d < local_88.d) {
      _d = local_88.d;
    }
    Mat::create(pMVar4,iVar14,_h,_d,uVar3,(size_t)_elemsize,_elempack,opt->blob_allocator);
  }
  iVar14 = -100;
  if ((pMVar4->data == (void *)0x0) || ((long)pMVar4->c * pMVar4->cstep == 0)) goto LAB_0039d718;
  if (local_88.elempack < local_d8.elempack) {
LAB_0039d6c5:
    iVar14 = (this->super_BinaryOp).op_type;
    uVar3 = iVar14 - 1;
    if ((uVar3 < 0xb) && ((0x7e5U >> (uVar3 & 0x1f) & 1) != 0)) {
      iVar14 = *(int *)(&DAT_005ab1c0 + (ulong)uVar3 * 4);
    }
    pMVar16 = &local_d8;
    b = &local_88;
  }
  else {
    if (local_88.elempack == local_d8.elempack) {
      auVar18._8_8_ = CONCAT44(local_88.c,local_88.d);
      auVar18._0_8_ = CONCAT44(local_88.c,local_88.d);
      auVar6._4_4_ = local_88.h;
      auVar6._0_4_ = local_88.w;
      auVar6._8_4_ = local_88.d;
      auVar6._12_4_ = local_88.c;
      auVar6 = vpmulld_avx(auVar18,auVar6);
      auVar20 = vpshufd_avx(auVar6,0x55);
      auVar6 = vpmulld_avx(auVar6,auVar20);
      auVar19._8_8_ = CONCAT44(local_d8.c,local_d8.d);
      auVar19._0_8_ = CONCAT44(local_d8.c,local_d8.d);
      auVar7._4_4_ = local_d8.h;
      auVar7._0_4_ = local_d8.w;
      auVar7._8_4_ = local_d8.d;
      auVar7._12_4_ = local_d8.c;
      auVar20 = vpmulld_avx(auVar19,auVar7);
      auVar7 = vpshufd_avx(auVar20,0x55);
      auVar20 = vpmulld_avx(auVar20,auVar7);
      if (auVar6._0_4_ * local_88.elempack < auVar20._0_4_ * local_d8.elempack) goto LAB_0039d6c5;
    }
    iVar14 = (this->super_BinaryOp).op_type;
    pMVar16 = &local_88;
    b = &local_d8;
  }
  binary_op_broadcast(pMVar16,b,pMVar4,iVar14,opt_00);
  iVar14 = 0;
LAB_0039d718:
  if (local_d8.refcount != (int *)0x0) {
    LOCK();
    *local_d8.refcount = *local_d8.refcount + -1;
    UNLOCK();
    if (*local_d8.refcount == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_88.refcount != (int *)0x0) {
    LOCK();
    *local_88.refcount = *local_88.refcount + -1;
    UNLOCK();
    if (*local_88.refcount == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        if (local_88.data != (void *)0x0) {
          free(local_88.data);
        }
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar14;
}

Assistant:

int BinaryOp_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    const int outdims = std::max(A.dims, B.dims);

    Mat A2 = A;
    Mat B2 = B;
    if (A.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (A.w * A.elempack == B.h * B.elempack)
                A2 = A.reshape(1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 2;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 3 && A.dims == 1)
        {
            if (A.w * A.elempack == B.c * B.elempack)
                A2 = A.reshape(1, 1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 3;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 3 && A.dims == 2)
            A2 = A.reshape(1, A.w, A.h, opt.workspace_allocator);
        if (outdims == 4 && A.dims == 1)
        {
            if (A.w * A.elempack == B.c * B.elempack)
                A2 = A.reshape(1, 1, 1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 4;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 4 && A.dims == 2)
            A2 = A.reshape(1, 1, A.w, A.h, opt.workspace_allocator);
        if (outdims == 4 && A.dims == 3)
            A2 = A.reshape(1, A.w, A.h, A.c, opt.workspace_allocator);
    }
    if (B.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (B.w * B.elempack == A.h * A.elempack)
                B2 = B.reshape(1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 2;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 3 && B.dims == 1)
        {
            if (B.w * B.elempack == A.c * A.elempack)
                B2 = B.reshape(1, 1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 3;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 3 && B.dims == 2)
            B2 = B.reshape(1, B.w, B.h, opt.workspace_allocator);
        if (outdims == 4 && B.dims == 1)
        {
            if (B.w * B.elempack == A.c * A.elempack)
                B2 = B.reshape(1, 1, 1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 4;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 4 && B.dims == 2)
            B2 = B.reshape(1, 1, B.w, B.h, opt.workspace_allocator);
        if (outdims == 4 && B.dims == 3)
            B2 = B.reshape(1, B.w, B.h, B.c, opt.workspace_allocator);
    }

    const int outw = std::max(A2.w, B2.w);
    const int outh = std::max(A2.h, B2.h);
    const int outd = std::max(A2.d, B2.d);
    const int outc = std::max(A2.c, B2.c);
    const size_t out_elemsize = std::max(A2.elemsize, B2.elemsize);
    const int out_elempack = std::max(A2.elempack, B2.elempack);

    Mat& top_blob = top_blobs[0];
    if (outdims == 1)
    {
        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 2)
    {
        top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 3)
    {
        top_blob.create(outw, outh, outc, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 4)
    {
        top_blob.create(outw, outh, outd, outc, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    const bool a_pack_is_lower = A2.elempack < B2.elempack;
    const bool a_pack_is_equal = A2.elempack == B2.elempack;
    const bool a_size_is_lower = A2.w * A2.h * A2.d * A2.c * A2.elempack < B2.w * B2.h * B2.d * B2.c * B2.elempack;
    if (a_pack_is_lower || (a_pack_is_equal && a_size_is_lower))
    {
        binary_op_broadcast(B2, A2, top_blob, get_reverse_op_type(op_type), opt);
    }
    else
    {
        binary_op_broadcast(A2, B2, top_blob, op_type, opt);
    }

    return 0;
}